

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

MIR_reg_t change_reg(gen_ctx_t gen_ctx,MIR_op_t *mem_op,MIR_reg_t reg,MIR_reg_t base_reg,
                    MIR_op_mode_t data_mode,MIR_insn_t insn,int out_p)

{
  MIR_context_t ctx_00;
  MIR_type_t type_00;
  MIR_reg_t hard_reg;
  int iVar1;
  MIR_reg_t local_5c;
  MIR_reg_t temp_addr_hreg;
  MIR_reg_t reload_hreg;
  MIR_type_t type;
  MIR_reg_t loc;
  MIR_context_t ctx;
  MIR_insn_t insn_local;
  MIR_op_mode_t data_mode_local;
  MIR_reg_t base_reg_local;
  MIR_reg_t reg_local;
  MIR_op_t *mem_op_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  gen_ctx_local._4_4_ = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)reg);
  if (0x21 < gen_ctx_local._4_4_) {
    type_00 = MIR_reg_type(ctx_00,reg - 0x21,(gen_ctx->curr_func_item->u).func);
    hard_reg = get_reload_hreg(gen_ctx,reg,type_00,out_p);
    if ((out_p != 0) || (local_5c = hard_reg, type_00 != MIR_T_I64)) {
      local_5c = get_reload_hreg(gen_ctx,0xffffffff,6,out_p);
    }
    iVar1 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn->field_0x18);
    if (iVar1 != 0) {
      __assert_fail("!MIR_addr_code_p (insn->code)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e7e,
                    "MIR_reg_t change_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_op_mode_t, MIR_insn_t, int)"
                   );
    }
    gen_ctx_local._4_4_ =
         add_ld_st(gen_ctx,mem_op,gen_ctx_local._4_4_,base_reg,data_mode,hard_reg,out_p,local_5c,
                   insn,out_p);
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static MIR_reg_t change_reg (gen_ctx_t gen_ctx, MIR_op_t *mem_op, MIR_reg_t reg, MIR_reg_t base_reg,
                             MIR_op_mode_t data_mode, MIR_insn_t insn, int out_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, reg);
  if (loc <= MAX_HARD_REG) return loc;
  MIR_type_t type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
  MIR_reg_t reload_hreg = get_reload_hreg (gen_ctx, reg, type, out_p);
  MIR_reg_t temp_addr_hreg
    = (out_p || type != MIR_T_I64 ? get_reload_hreg (gen_ctx, MIR_NON_VAR, MIR_T_I64, out_p)
                                  : reload_hreg);
  gen_assert (!MIR_addr_code_p (insn->code));
  return add_ld_st (gen_ctx, mem_op, loc, base_reg, data_mode, reload_hreg, out_p, temp_addr_hreg,
                    insn, out_p);
}